

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixRead(sqlite3_file *id,void *pBuf,int amt,sqlite3_int64 offset)

{
  sqlite3_io_methods *psVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  size_t __n;
  void *pvVar6;
  int iVar7;
  
  psVar1 = id[10].pMethods;
  if ((long)psVar1 - offset != 0 && offset <= (long)psVar1) {
    if (amt + offset <= (long)psVar1) {
      memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),(long)amt);
      return 0;
    }
    iVar7 = (int)((long)psVar1 - offset);
    __n = (size_t)iVar7;
    memcpy(pBuf,(void *)((long)&(id[0xd].pMethods)->iVersion + offset),__n);
    pBuf = (void *)((long)pBuf + __n);
    amt = amt - iVar7;
    offset = offset + __n;
  }
  uVar2 = (*aSyscall[9].pCurrent)((ulong)*(uint *)&id[3].pMethods,pBuf,(long)amt,offset);
  iVar7 = 0;
  uVar5 = amt;
  if (amt != uVar2) {
    iVar7 = 0;
    pvVar6 = pBuf;
    uVar4 = amt;
    do {
      uVar5 = uVar2;
      if ((int)uVar5 < 0) {
        piVar3 = __errno_location();
        if (*piVar3 != 4) {
          *(int *)&id[4].pMethods = *piVar3;
          iVar7 = 0;
          break;
        }
      }
      else {
        if (uVar5 == 0) {
          uVar5 = 0;
          break;
        }
        offset = offset + (ulong)(uVar5 & 0x7fffffff);
        iVar7 = iVar7 + uVar5;
        pvVar6 = (void *)((long)pvVar6 + (ulong)(uVar5 & 0x7fffffff));
        uVar4 = uVar4 - uVar5;
      }
      uVar5 = uVar4;
      uVar2 = (*aSyscall[9].pCurrent)
                        ((ulong)*(uint *)&id[3].pMethods,pvVar6,(long)(int)uVar5,offset);
      uVar4 = uVar5;
    } while (uVar5 != uVar2);
  }
  uVar5 = uVar5 + iVar7;
  iVar7 = 0;
  if (amt - uVar5 != 0) {
    if ((int)uVar5 < 0) {
      if ((0x22 < (ulong)*(uint *)&id[4].pMethods) ||
         (iVar7 = 0x210a, (0x400000060U >> ((ulong)*(uint *)&id[4].pMethods & 0x3f) & 1) == 0)) {
        iVar7 = 0x10a;
      }
    }
    else {
      *(undefined4 *)&id[4].pMethods = 0;
      memset((void *)((long)pBuf + (ulong)uVar5),0,(long)(int)(amt - uVar5));
      iVar7 = 0x20a;
    }
  }
  return iVar7;
}

Assistant:

static int unixRead(
  sqlite3_file *id,
  void *pBuf,
  int amt,
  sqlite3_int64 offset
){
  unixFile *pFile = (unixFile *)id;
  int got;
  assert( id );
  assert( offset>=0 );
  assert( amt>0 );

  /* If this is a database file (not a journal, super-journal or temp
  ** file), the bytes in the locking range should never be read or written. */
#if 0
  assert( pFile->pPreallocatedUnused==0
       || offset>=PENDING_BYTE+512
       || offset+amt<=PENDING_BYTE
  );
#endif

#if SQLITE_MAX_MMAP_SIZE>0
  /* Deal with as much of this read request as possible by transferring
  ** data from the memory mapping using memcpy().  */
  if( offset<pFile->mmapSize ){
    if( offset+amt <= pFile->mmapSize ){
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], amt);
      return SQLITE_OK;
    }else{
      int nCopy = pFile->mmapSize - offset;
      memcpy(pBuf, &((u8 *)(pFile->pMapRegion))[offset], nCopy);
      pBuf = &((u8 *)pBuf)[nCopy];
      amt -= nCopy;
      offset += nCopy;
    }
  }
#endif

  got = seekAndRead(pFile, offset, pBuf, amt);
  if( got==amt ){
    return SQLITE_OK;
  }else if( got<0 ){
    /* pFile->lastErrno has been set by seekAndRead().
    ** Usually we return SQLITE_IOERR_READ here, though for some
    ** kinds of errors we return SQLITE_IOERR_CORRUPTFS.  The
    ** SQLITE_IOERR_CORRUPTFS will be converted into SQLITE_CORRUPT
    ** prior to returning to the application by the sqlite3ApiExit()
    ** routine.
    */
    switch( pFile->lastErrno ){
      case ERANGE:
      case EIO:
#ifdef ENXIO
      case ENXIO:
#endif
#ifdef EDEVERR
      case EDEVERR:
#endif
        return SQLITE_IOERR_CORRUPTFS;
    }
    return SQLITE_IOERR_READ;
  }else{
    storeLastErrno(pFile, 0);   /* not a system error */
    /* Unread parts of the buffer must be zero-filled */
    memset(&((char*)pBuf)[got], 0, amt-got);
    return SQLITE_IOERR_SHORT_READ;
  }
}